

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::ConvertCase
                   (string *__return_storage_ptr__,string *input,Case output_case,Case input_case)

{
  char cVar1;
  char cVar2;
  int iVar3;
  bool is_upper;
  size_t i;
  ulong uVar4;
  pointer pcVar5;
  _Function_base *this;
  char cVar6;
  int iVar7;
  string *s_1;
  string s;
  code *local_70 [2];
  code *local_60;
  code *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  if (output_case == kKeep) goto switchD_0013e7b1_caseD_3;
  if (input_case - kUpperCamel < 2) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    for (uVar4 = 0; uVar4 < input->_M_string_length; uVar4 = uVar4 + 1) {
      pcVar5 = (input->_M_dataplus)._M_p;
      if (uVar4 == 0) {
LAB_0013e83a:
        cVar6 = *pcVar5;
LAB_0013e83e:
        CharToLower(cVar6);
      }
      else {
        cVar6 = pcVar5[uVar4];
        iVar7 = (int)cVar6;
        if ((iVar7 != 0x5f) && (iVar3 = islower(iVar7), iVar3 == 0)) {
          cVar2 = pcVar5[uVar4 - 1];
          iVar3 = islower((int)cVar2);
          if ((iVar3 != 0) || ((0xfffffff5 < (int)cVar2 - 0x3aU && (9 < iVar7 - 0x30U)))) {
            std::__cxx11::string::push_back((char)&s);
            pcVar5 = (input->_M_dataplus)._M_p + uVar4;
            goto LAB_0013e83a;
          }
          goto LAB_0013e83e;
        }
      }
      std::__cxx11::string::push_back((char)&s);
    }
    ConvertCase(__return_storage_ptr__,&s,output_case,kSnake);
LAB_0013e8d3:
    std::__cxx11::string::~string((string *)&s);
    return __return_storage_ptr__;
  }
  if (input_case == kDasher) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    for (uVar4 = 0; uVar4 < input->_M_string_length; uVar4 = uVar4 + 1) {
      if ((input->_M_dataplus)._M_p[uVar4] == '-') {
        std::__cxx11::string::append((char *)&s);
      }
      else {
        std::__cxx11::string::push_back((char)&s);
      }
    }
    ConvertCase(__return_storage_ptr__,&s,output_case,kSnake);
    goto LAB_0013e8d3;
  }
  if (input_case == kKeep) {
    puts("WARNING: Converting from kKeep case.");
  }
  cVar6 = (char)__return_storage_ptr__;
  switch(output_case) {
  case kUpperCamel:
    is_upper = true;
    break;
  case kLowerCamel:
    is_upper = false;
    break;
  case kScreamingSnake:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar4 = 0;
    do {
      if (input->_M_string_length <= uVar4) {
        return __return_storage_ptr__;
      }
      pcVar5 = (input->_M_dataplus)._M_p;
      if (uVar4 == 0) {
LAB_0013eadb:
        cVar2 = *pcVar5;
LAB_0013eadf:
        CharToUpper(cVar2);
      }
      else {
        cVar2 = pcVar5[uVar4];
        iVar7 = (int)cVar2;
        if (iVar7 != 0x5f) {
          iVar3 = islower(iVar7);
          if (iVar3 == 0) {
            cVar1 = pcVar5[uVar4 - 1];
            iVar3 = islower((int)cVar1);
            if ((iVar3 != 0) || ((0xfffffff5 < (int)cVar1 - 0x3aU && (9 < iVar7 - 0x30U)))) {
              std::__cxx11::string::push_back(cVar6);
              pcVar5 = (input->_M_dataplus)._M_p + uVar4;
              goto LAB_0013eadb;
            }
          }
          goto LAB_0013eadf;
        }
      }
      std::__cxx11::string::push_back(cVar6);
      uVar4 = uVar4 + 1;
    } while( true );
  case kAllUpper:
    local_50[1] = (code *)0x0;
    local_50[0] = CharToUpper;
    local_38 = std::_Function_handler<char_(char),_char_(*)(char)>::_M_invoke;
    local_40 = std::_Function_handler<char_(char),_char_(*)(char)>::_M_manager;
    anon_unknown_1::ToAll(__return_storage_ptr__,input,(function<char_(char)> *)local_50);
    this = (_Function_base *)local_50;
    goto LAB_0013eb39;
  case kAllLower:
    local_70[1] = (code *)0x0;
    local_70[0] = CharToLower;
    local_58 = std::_Function_handler<char_(char),_char_(*)(char)>::_M_invoke;
    local_60 = std::_Function_handler<char_(char),_char_(*)(char)>::_M_manager;
    anon_unknown_1::ToAll(__return_storage_ptr__,input,(function<char_(char)> *)local_70);
    this = (_Function_base *)local_70;
LAB_0013eb39:
    std::_Function_base::~_Function_base(this);
    return __return_storage_ptr__;
  case kDasher:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar2 = '\0';
    for (uVar4 = 0; uVar4 < input->_M_string_length; uVar4 = uVar4 + 1) {
      pcVar5 = (input->_M_dataplus)._M_p;
      if (pcVar5[uVar4] == '_') {
        if (((uVar4 != 0) && (cVar2 != '/')) &&
           ((input->_M_string_length <= uVar4 + 1 || (9 < (int)pcVar5[uVar4 + 1] - 0x30U)))) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        std::__cxx11::string::push_back(cVar6);
      }
      cVar2 = pcVar5[uVar4];
    }
    return __return_storage_ptr__;
  case kSnake2:
    if (1 < input->_M_string_length) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      for (uVar4 = 0; pcVar5 = (input->_M_dataplus)._M_p, uVar4 < input->_M_string_length - 1;
          uVar4 = uVar4 + 1) {
        if ((pcVar5[uVar4] != '_') || (9 < (int)pcVar5[uVar4 + 1] - 0x30U)) {
          std::__cxx11::string::push_back(cVar6);
          pcVar5 = (input->_M_dataplus)._M_p;
          if ((int)pcVar5[uVar4] - 0x30U < 10) {
            iVar3 = (int)pcVar5[uVar4 + 1];
            iVar7 = isalpha(iVar3);
            if ((iVar7 != 0) && (iVar7 = islower(iVar3), iVar7 != 0)) {
              std::__cxx11::string::push_back(cVar6);
            }
          }
        }
      }
      std::__cxx11::string::push_back(cVar6);
      return __return_storage_ptr__;
    }
  default:
switchD_0013e7b1_caseD_3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
    return __return_storage_ptr__;
  }
  anon_unknown_1::ToCamelCase(__return_storage_ptr__,input,is_upper);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertCase(const std::string &input, Case output_case,
                        Case input_case) {
  if (output_case == Case::kKeep) return input;
  // The output cases expect snake_case inputs, so if we don't have that input
  // format, try to convert to snake_case.
  switch (input_case) {
    case Case::kLowerCamel:
    case Case::kUpperCamel:
      return ConvertCase(CamelToSnake(input), output_case);
    case Case::kDasher: return ConvertCase(DasherToSnake(input), output_case);
    case Case::kKeep: printf("WARNING: Converting from kKeep case.\n"); break;
    default:
    case Case::kSnake:
    case Case::kScreamingSnake:
    case Case::kAllLower:
    case Case::kAllUpper: break;
  }

  switch (output_case) {
    case Case::kUpperCamel: return ToCamelCase(input, true);
    case Case::kLowerCamel: return ToCamelCase(input, false);
    case Case::kSnake: return input;
    case Case::kScreamingSnake: return ToSnakeCase(input, true);
    case Case::kAllUpper: return ToAll(input, CharToUpper);
    case Case::kAllLower: return ToAll(input, CharToLower);
    case Case::kDasher: return ToDasher(input);
    case Case::kSnake2: return SnakeToSnake2(input);
    default:
    case Case::kUnknown: return input;
  }
}